

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O3

void operator_attack(op_type_conflict *op_pt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  double dVar5;
  
  dVar5 = op_pt->amp;
  dVar5 = ((op_pt->a3 * dVar5 + op_pt->a2) * dVar5 + op_pt->a1) * dVar5 + op_pt->a0;
  op_pt->amp = dVar5;
  uVar1 = op_pt->generator_pos;
  if (0xffff < uVar1) {
    uVar3 = uVar1 >> 0x10;
    uVar2 = op_pt->cur_env_step;
    do {
      uVar2 = uVar2 + 1;
      if ((op_pt->env_step_a & uVar2) == 0) {
        if (1.0 < dVar5) {
          op_pt->op_state = 1;
          op_pt->amp = 1.0;
          op_pt->step_amp = 1.0;
          dVar5 = 1.0;
        }
        bVar4 = op_pt->step_skip_pos_a * '\x02';
        if (bVar4 < 2) {
          bVar4 = 1;
        }
        op_pt->step_skip_pos_a = bVar4;
        if ((bVar4 & (byte)op_pt->env_step_skip_a) != 0) {
          op_pt->step_amp = dVar5;
        }
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    op_pt->cur_env_step = op_pt->cur_env_step + (uVar1 >> 0x10);
  }
  op_pt->generator_pos = uVar1 & 0xffff;
  return;
}

Assistant:

static void operator_attack(op_type* op_pt)
{
	Bit32u num_steps_add;
	Bit32u ct;
	
	op_pt->amp = ((op_pt->a3*op_pt->amp + op_pt->a2)*op_pt->amp + op_pt->a1)*op_pt->amp + op_pt->a0;

	num_steps_add = op_pt->generator_pos/FIXEDPT;		// number of (standardized) samples
	for (ct=0; ct<num_steps_add; ct++)
	{
		op_pt->cur_env_step++;	// next sample
		if ((op_pt->cur_env_step & op_pt->env_step_a)==0)
		{		// check if next step already reached
			if (op_pt->amp > 1.0)
			{
				// attack phase finished, next: decay
				op_pt->op_state = OF_TYPE_DEC;
				op_pt->amp = 1.0;
				op_pt->step_amp = 1.0;
			}
			op_pt->step_skip_pos_a <<= 1;
			if (op_pt->step_skip_pos_a==0) op_pt->step_skip_pos_a = 1;
			if (op_pt->step_skip_pos_a & op_pt->env_step_skip_a)
			{	// check if required to skip next step
				op_pt->step_amp = op_pt->amp;
			}
		}
	}
	op_pt->generator_pos -= num_steps_add*FIXEDPT;
}